

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O3

void __thiscall
wasm::OptimizeInstructions::optimizeStoredValue
          (OptimizeInstructions *this,Expression **value,Index bytes)

{
  Expression *pEVar1;
  Type type;
  matched_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>_> candidate;
  uint x;
  bool bVar2;
  Index IVar3;
  Literal *this_00;
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<int>_>_>_>_&>
  local_118;
  Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> local_f0;
  anon_union_16_5_9943fe1e_for_Literal_0 local_e0;
  undefined8 local_d0;
  long local_c0;
  undefined8 local_a0;
  undefined4 local_98;
  SubMatchers<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<int>_>_>_>_&>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<int>_>_>_>_&>
  local_90;
  anon_union_16_5_9943fe1e_for_Literal_0 local_78;
  undefined8 local_68;
  Expression **local_58;
  Expression *local_38;
  Expression *extended;
  int32_t leftShift;
  int32_t rightShift;
  
  pEVar1 = *value;
  type.id = (pEVar1->type).id;
  if ((type.id & 0xfffffffffffffffe) == 2) {
    if (pEVar1->_id == ConstId) {
      this_00 = (Literal *)(pEVar1 + 1);
      if (bytes == 4 && type.id == 3) {
        local_e0.i64 = 0xffffffff;
        local_d0 = 3;
        Literal::and_((Literal *)&local_78.func,this_00,(Literal *)&local_e0.func);
        Literal::operator=(this_00,(Literal *)&local_78.func);
      }
      else {
        x = 0xffffffff >> (-(char)(bytes * 8) & 0x1fU);
        if (0x1f < (int)(bytes * 8)) {
          x = 0xffffffff;
        }
        Literal::makeFromInt32((Literal *)&local_e0.func,x,type);
        Literal::and_((Literal *)&local_78.func,this_00,(Literal *)&local_e0.func);
        Literal::operator=(this_00,(Literal *)&local_78.func);
      }
      Literal::~Literal((Literal *)&local_78.func);
      Literal::~Literal((Literal *)&local_e0.func);
    }
    candidate = (matched_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>_>)
                *value;
    if ((candidate->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id ==
        BinaryId) {
      if (candidate->op == AndInt32) {
        pEVar1 = candidate->right;
        if ((pEVar1->_id == ConstId) && ((pEVar1->type).id == 2)) {
          if (*(long *)(pEVar1 + 2) != 2) {
            __assert_fail("type == Type::i32",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/literal.h"
                          ,0x118,"int32_t wasm::Literal::geti32() const");
          }
          if (((bytes == 1) && (pEVar1[1]._id == 0xff)) ||
             ((bytes == 2 && (pEVar1[1]._id == 0xffff)))) {
            *value = candidate->left;
          }
        }
      }
      else if ((candidate->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type
               .id == 2) {
        local_58 = &extended;
        extended._0_4_ = 0;
        local_c0 = (long)&extended + 4;
        extended._4_4_ = 0;
        local_f0.binder = &local_38;
        local_38 = (Expression *)0x0;
        local_118.submatchers.curr = &local_f0;
        local_118.submatchers.next.curr =
             (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<int>_>_>_>
              *)&local_78;
        local_68 = 0;
        local_78.i64 = 0;
        local_90.curr = &local_118;
        local_118.binder =
             (matched_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>_> *)
             0x0;
        local_118.data = ShlInt32;
        local_90.next.curr =
             (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<int>_>_>_>
              *)&local_e0;
        local_d0 = 0;
        local_e0.i64 = 0;
        local_a0 = 0;
        local_98 = 0xb;
        if (candidate->op == ShrSInt32) {
          bVar2 = Match::Internal::
                  Components<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>,_0,_wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<int>_>_>_>_&>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<int>_>_>_>_&>
                  ::match(candidate,&local_90);
          pEVar1 = local_38;
          if ((((bVar2) && ((int)extended == extended._4_4_)) && ((int)extended != 0)) &&
             (local_38 != (Expression *)0x0)) {
            IVar3 = Properties::getSignExtBits((Expression *)candidate);
            if (bytes << 3 <= IVar3) {
              *value = pEVar1;
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void optimizeStoredValue(Expression*& value, Index bytes) {
    if (!value->type.isInteger()) {
      return;
    }
    // truncates constant values during stores
    // (i32|i64).store(8|16|32)(p, C)   ==>
    //    (i32|i64).store(8|16|32)(p, C & mask)
    if (auto* c = value->dynCast<Const>()) {
      if (value->type == Type::i64 && bytes == 4) {
        c->value = c->value.and_(Literal(uint64_t(0xffffffff)));
      } else {
        c->value = c->value.and_(
          Literal::makeFromInt32(Bits::lowBitMask(bytes * 8), value->type));
      }
    }
    // stores of fewer bits truncates anyhow
    if (auto* binary = value->dynCast<Binary>()) {
      if (binary->op == AndInt32) {
        if (auto* right = binary->right->dynCast<Const>()) {
          if (right->type == Type::i32) {
            auto mask = right->value.geti32();
            if ((bytes == 1 && mask == 0xff) ||
                (bytes == 2 && mask == 0xffff)) {
              value = binary->left;
            }
          }
        }
      } else if (auto* ext = Properties::getSignExtValue(binary)) {
        // if sign extending the exact bit size we store, we can skip the
        // extension if extending something bigger, then we just alter bits we
        // don't save anyhow
        if (Properties::getSignExtBits(binary) >= Index(bytes) * 8) {
          value = ext;
        }
      }
    }
  }